

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall
cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName,TargetType targetType)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchDirs;
  string tmpOutputFile;
  ostringstream emsg;
  allocator local_249;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  std::__cxx11::string::assign((char *)&this->FindErrorMessage);
  std::__cxx11::string::assign((char *)&this->OutputFile);
  std::__cxx11::string::string((string *)&local_208,"/",(allocator *)&local_1a8);
  if (targetType == EXECUTABLE) {
    std::__cxx11::string::append((string *)&local_208);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&local_1a8,"CMAKE_EXECUTABLE_SUFFIX",(allocator *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((char *)&local_208);
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&local_1a8,"CMAKE_STATIC_LIBRARY_PREFIX",(allocator *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((char *)&local_208);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_208);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&local_1a8,"CMAKE_STATIC_LIBRARY_SUFFIX",(allocator *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((char *)&local_208);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1a8,"",(allocator *)&local_248);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&local_1a8,"CMAKE_TRY_COMPILE_CONFIGURATION",(allocator *)&local_248);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    std::__cxx11::string::string((string *)&local_1a8,"/",(allocator *)&local_248);
    std::__cxx11::string::append((char *)&local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_228,(value_type *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  std::__cxx11::string::string((string *)&local_1a8,"/Debug",(allocator *)&local_248);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1a8,"/Development",(allocator *)&local_248);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  pbVar5 = local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar5 == local_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Unable to find the executable at any of:\n");
      std::operator+(&local_1c8,"  ",&this->BinaryDirectory);
      std::__cxx11::string::string((string *)&local_1e8,"\n",&local_249);
      cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_248,&local_1c8,&local_228,&local_208,&local_1e8);
      poVar4 = std::operator<<(&local_1a8,(string *)&local_248);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_003f78ad:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      return;
    }
    std::__cxx11::string::string((string *)&local_1a8,(string *)&this->BinaryDirectory);
    std::__cxx11::string::append((string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_1a8);
    bVar2 = cmsys::SystemTools::FileExists((char *)local_1a8._vptr_basic_ostream);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath(&local_248,(string *)&local_1a8);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1a8);
      goto LAB_003f78ad;
    }
    std::__cxx11::string::~string((string *)&local_1a8);
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName,
                                      cmStateEnums::TargetType targetType)
{
  this->FindErrorMessage = "";
  this->OutputFile = "";
  std::string tmpOutputFile = "/";
  if (targetType == cmStateEnums::EXECUTABLE) {
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_EXECUTABLE_SUFFIX");
  } else // if (targetType == cmStateEnums::STATIC_LIBRARY)
  {
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX");
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX");
  }

  // a list of directories where to search for the compilation result
  // at first directly in the binary dir
  std::vector<std::string> searchDirs;
  searchDirs.push_back("");

  const char* config =
    this->Makefile->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  // if a config was specified try that first
  if (config && config[0]) {
    std::string tmp = "/";
    tmp += config;
    searchDirs.push_back(tmp);
  }
  searchDirs.push_back("/Debug");
#if defined(__APPLE__)
  std::string app = "/Debug/" + targetName + ".app";
  searchDirs.push_back(app);
#endif
  searchDirs.push_back("/Development");

  for (std::vector<std::string>::const_iterator it = searchDirs.begin();
       it != searchDirs.end(); ++it) {
    std::string command = this->BinaryDirectory;
    command += *it;
    command += tmpOutputFile;
    if (cmSystemTools::FileExists(command.c_str())) {
      this->OutputFile = cmSystemTools::CollapseFullPath(command);
      return;
    }
  }

  std::ostringstream emsg;
  emsg << "Unable to find the executable at any of:\n";
  emsg << cmWrap("  " + this->BinaryDirectory, searchDirs, tmpOutputFile, "\n")
       << "\n";
  this->FindErrorMessage = emsg.str();
}